

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

int cm_zlib_deflateParams(z_streamp strm,int level,int strategy)

{
  deflate_state *s;
  Posf *__s;
  int iVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  
  iVar1 = deflateStateCheck(strm);
  if (iVar1 != 0) {
    return -2;
  }
  uVar3 = 6;
  if (level != -1) {
    uVar3 = level;
  }
  if (4 < (uint)strategy || 9 < uVar3) {
    return -2;
  }
  s = strm->state;
  if (((s->strategy == strategy) &&
      (configuration_table[s->level].func == configuration_table[uVar3].func)) ||
     (s->last_flush == -2)) goto LAB_008772e1;
  iVar1 = cm_zlib_deflate(strm,5);
  if (iVar1 == -2) {
    iVar1 = -2;
LAB_008772d7:
    bVar4 = false;
  }
  else {
    iVar1 = -5;
    if (strm->avail_in != 0) goto LAB_008772d7;
    bVar4 = (ulong)s->lookahead + ((ulong)s->strstart - s->block_start) == 0;
  }
  if (!bVar4) {
    return iVar1;
  }
LAB_008772e1:
  if (s->level != uVar3) {
    if ((s->level == 0) && (s->matches != 0)) {
      if (s->matches == 1) {
        slide_hash(s);
      }
      else {
        __s = s->head;
        uVar2 = (ulong)(s->hash_size - 1);
        __s[uVar2] = 0;
        memset(__s,0,uVar2 * 2);
      }
      s->matches = 0;
    }
    s->level = uVar3;
    s->max_lazy_match = (uint)configuration_table[uVar3].max_lazy;
    s->good_match = (uint)configuration_table[uVar3].good_length;
    s->nice_match = (uint)configuration_table[uVar3].nice_length;
    s->max_chain_length = (uint)configuration_table[uVar3].max_chain;
  }
  s->strategy = strategy;
  return 0;
}

Assistant:

int ZEXPORT deflateParams(z_streamp strm, int level, int strategy) {
    deflate_state *s;
    compress_func func;

    if (deflateStateCheck(strm)) return Z_STREAM_ERROR;
    s = strm->state;

#ifdef FASTEST
    if (level != 0) level = 1;
#else
    if (level == Z_DEFAULT_COMPRESSION) level = 6;
#endif
    if (level < 0 || level > 9 || strategy < 0 || strategy > Z_FIXED) {
        return Z_STREAM_ERROR;
    }
    func = configuration_table[s->level].func;

    if ((strategy != s->strategy || func != configuration_table[level].func) &&
        s->last_flush != -2) {
        /* Flush the last buffer: */
        int err = deflate(strm, Z_BLOCK);
        if (err == Z_STREAM_ERROR)
            return err;
        if (strm->avail_in || (s->strstart - s->block_start) + s->lookahead)
            return Z_BUF_ERROR;
    }
    if (s->level != level) {
        if (s->level == 0 && s->matches != 0) {
            if (s->matches == 1)
                slide_hash(s);
            else
                CLEAR_HASH(s);
            s->matches = 0;
        }
        s->level = level;
        s->max_lazy_match   = configuration_table[level].max_lazy;
        s->good_match       = configuration_table[level].good_length;
        s->nice_match       = configuration_table[level].nice_length;
        s->max_chain_length = configuration_table[level].max_chain;
    }
    s->strategy = strategy;
    return Z_OK;
}